

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int doindent(int cols)

{
  int iVar1;
  
  if ((curbp->b_flag & 4U) != 0) {
    iVar1 = linsert(cols,0x20);
    return iVar1;
  }
  iVar1 = cols / curbp->b_tabw;
  if (iVar1 == 0) {
LAB_0011a66a:
    iVar1 = cols % curbp->b_tabw;
    if (iVar1 != 0) {
      iVar1 = linsert(iVar1,0x20);
      if (iVar1 == 0) goto LAB_0011a6a1;
    }
    iVar1 = 1;
  }
  else {
    iVar1 = linsert(iVar1,9);
    if (iVar1 != 0) goto LAB_0011a66a;
LAB_0011a6a1:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
doindent(int cols)
{
	int n;

	if (curbp->b_flag & BFNOTAB)
		return (linsert(cols, ' '));
	if ((n = cols / curbp->b_tabw) != 0 && linsert(n, '\t') == FALSE)
		return (FALSE);
	if ((n = cols % curbp->b_tabw) != 0 && linsert(n, ' ') == FALSE)
		return (FALSE);
	return (TRUE);
}